

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int collect_addr_uses(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,VARR_bb_insn_t *bb_mem_insns)

{
  uint uVar1;
  bb_insn_t pbVar2;
  MIR_insn_t insn;
  bitmap_t bm;
  ulong uVar3;
  VARR_bb_insn_t *pVVar4;
  int iVar5;
  int iVar6;
  bb_insn_t_conflict *__ptr;
  ulong uVar7;
  bb_insn_t_conflict pbVar8;
  size_t sVar9;
  
  if (((int)bb_insn->gvn_val - 0x22U < 0xfffffffc) &&
     (iVar5 = move_p((MIR_insn_t)bb_insn), iVar5 == 0)) {
LAB_00161c6c:
    __assert_fail("MIR_addr_code_p (bb_insn->insn->code) || move_p (bb_insn->insn)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xb15,"int collect_addr_uses(gen_ctx_t, bb_insn_t, VARR_bb_insn_t *)");
  }
  pbVar2 = (bb_insn->bb_insn_link).prev;
  iVar5 = 1;
  do {
    if (pbVar2 == (bb_insn_t)0x0) {
      return iVar5;
    }
    pbVar8 = (bb_insn_t_conflict)pbVar2->insn;
    insn = pbVar8->insn;
    if (insn->ops[*(uint *)&pbVar2->field_0x14].field_0x8 == '\v') {
      if ((1 < *(uint *)&pbVar2->field_0x14) || ((*(ulong *)&insn->field_0x18 & 0xfffffffc) != 0)) {
        __assert_fail("move_code_p (se->use->insn->code) && se->use_op_num <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0xb18,"int collect_addr_uses(gen_ctx_t, bb_insn_t, VARR_bb_insn_t *)");
      }
      if (bb_mem_insns != (VARR_bb_insn_t *)0x0) {
        __ptr = bb_mem_insns->varr;
        if (__ptr == (bb_insn_t_conflict *)0x0) {
          collect_addr_uses_cold_3();
LAB_00161c62:
          collect_addr_uses_cold_2();
LAB_00161c67:
          collect_addr_uses_cold_1();
          goto LAB_00161c6c;
        }
        sVar9 = bb_mem_insns->els_num;
        uVar7 = sVar9 + 1;
        if (bb_mem_insns->size < uVar7) {
          sVar9 = (uVar7 >> 1) + uVar7;
          __ptr = (bb_insn_t_conflict *)realloc(__ptr,sVar9 * 8);
          bb_mem_insns->varr = __ptr;
          bb_mem_insns->size = sVar9;
          sVar9 = bb_mem_insns->els_num;
          uVar7 = sVar9 + 1;
        }
        bb_mem_insns->els_num = uVar7;
LAB_00161c17:
        __ptr[sVar9] = pbVar8;
      }
    }
    else {
      iVar6 = move_p(insn);
      if (iVar6 == 0) {
        iVar5 = 0;
      }
      else {
        uVar1 = pbVar8->index;
        uVar7 = (ulong)uVar1;
        bm = gen_ctx->temp_bitmap2;
        bitmap_expand(bm,uVar7 + 1);
        if (bm == (bitmap_t)0x0) goto LAB_00161c62;
        uVar1 = uVar1 >> 6;
        uVar3 = bm->varr[uVar1];
        bm->varr[uVar1] = uVar3 | 1L << (uVar7 & 0x3f);
        if ((uVar3 >> (uVar7 & 0x3f) & 1) == 0) {
          pVVar4 = gen_ctx->temp_bb_insns2;
          __ptr = pVVar4->varr;
          if (__ptr != (bb_insn_t_conflict *)0x0) {
            sVar9 = pVVar4->els_num;
            pbVar8 = (bb_insn_t_conflict)pbVar2->insn;
            uVar7 = sVar9 + 1;
            if (pVVar4->size < uVar7) {
              sVar9 = (uVar7 >> 1) + uVar7;
              __ptr = (bb_insn_t_conflict *)realloc(__ptr,sVar9 * 8);
              pVVar4->varr = __ptr;
              pVVar4->size = sVar9;
              sVar9 = pVVar4->els_num;
              uVar7 = sVar9 + 1;
            }
            pVVar4->els_num = uVar7;
            goto LAB_00161c17;
          }
          goto LAB_00161c67;
        }
      }
    }
    pbVar2 = (pbVar2->bb_insn_link).prev;
  } while( true );
}

Assistant:

static int collect_addr_uses (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                              VARR (bb_insn_t) * bb_mem_insns) {
  int res = TRUE;

  gen_assert (MIR_addr_code_p (bb_insn->insn->code) || move_p (bb_insn->insn));
  for (ssa_edge_t se = bb_insn->insn->ops[0].data; se != NULL; se = se->next_use) {
    if (se->use->insn->ops[se->use_op_num].mode == MIR_OP_VAR_MEM) {
      gen_assert (move_code_p (se->use->insn->code) && se->use_op_num <= 1);
      if (bb_mem_insns != NULL) VARR_PUSH (bb_insn_t, bb_mem_insns, se->use);
      continue;
    }
    if (!move_p (se->use->insn)) {
      res = FALSE;
    } else if (bitmap_set_bit_p (temp_bitmap2, se->use->index)) {
      VARR_PUSH (bb_insn_t, temp_bb_insns2, se->use);
    }
  }
  return res;
}